

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

TRef snap_replay_const(jit_State *J,IRIns *ir)

{
  long in_RSI;
  jit_State *in_RDI;
  jit_State *unaff_retaddr;
  IRType t;
  undefined4 in_stack_fffffffffffffff8;
  IROp in_stack_fffffffffffffffc;
  TRef TVar1;
  
  t = (IRType)((ulong)in_RSI >> 0x20);
  switch(*(undefined1 *)(in_RSI + 5)) {
  case 0x16:
    TVar1 = (0x7fff - (*(byte *)(in_RSI + 4) & 0x1f)) + (*(byte *)(in_RSI + 4) & 0x1f) * 0x1000000;
    break;
  case 0x17:
    TVar1 = lj_ir_kint(in_RDI,t);
    break;
  case 0x18:
    TVar1 = lj_ir_kgc(unaff_retaddr,
                      (GCobj *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (IRType)((ulong)in_RDI >> 0x20));
    break;
  case 0x19:
    TVar1 = lj_ir_kptr_(unaff_retaddr,in_stack_fffffffffffffffc,in_RDI);
    break;
  default:
    TVar1 = 0x7fff;
    break;
  case 0x1b:
    TVar1 = lj_ir_knull(in_RDI,t);
    break;
  case 0x1c:
  case 0x1d:
    TVar1 = lj_ir_k64(unaff_retaddr,in_stack_fffffffffffffffc,(uint64_t)in_RDI);
  }
  return TVar1;
}

Assistant:

static TRef snap_replay_const(jit_State *J, IRIns *ir)
{
  /* Only have to deal with constants that can occur in stack slots. */
  switch ((IROp)ir->o) {
  case IR_KPRI: return TREF_PRI(irt_type(ir->t));
  case IR_KINT: return lj_ir_kint(J, ir->i);
  case IR_KGC: return lj_ir_kgc(J, ir_kgc(ir), irt_t(ir->t));
  case IR_KNUM: case IR_KINT64:
    return lj_ir_k64(J, (IROp)ir->o, ir_k64(ir)->u64);
  case IR_KPTR: return lj_ir_kptr(J, ir_kptr(ir));  /* Continuation. */
  case IR_KNULL: return lj_ir_knull(J, irt_type(ir->t));
  default: lj_assertJ(0, "bad IR constant op %d", ir->o); return TREF_NIL;
  }
}